

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrame(void)

{
  ImVec2 *pIVar1;
  ImVector<ImGuiViewportP_*> *pIVar2;
  ImVector<ImGuiWindow_*> *this;
  float *pfVar3;
  ImGuiNavMoveResult *pIVar4;
  ImGuiNextWindowData *pIVar5;
  int *piVar6;
  ImVec2 *pIVar7;
  float fVar8;
  float fVar9;
  ImFontAtlas *pIVar10;
  char *pcVar11;
  _func_bool_ImGuiViewport_ptr *p_Var12;
  _func_float_ImGuiViewport_ptr *p_Var13;
  ImGuiViewportP *pIVar14;
  _func_void_ImGuiViewport_ptr *p_Var15;
  ImVec2 IVar16;
  byte bVar17;
  ImGuiContext *ctx;
  ImGuiContext *pIVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  int n;
  undefined4 extraout_EAX;
  ImGuiID IVar23;
  ImGuiKeyModFlags IVar24;
  ImGuiInputSource IVar25;
  ImFont **ppIVar26;
  long lVar27;
  ImGuiViewportP **ppIVar28;
  ImGuiPlatformMonitor *pIVar29;
  ImGuiViewportP **ppIVar30;
  ImGuiWindow **ppIVar31;
  ImGuiViewportP *pIVar32;
  ImFont *font;
  ImGuiWindow *pIVar33;
  ImGuiPopupData *pIVar34;
  ImRect *pIVar35;
  int i;
  ImGuiID IVar36;
  ImGuiWindow *window;
  long lVar37;
  ImGuiWindow *parent;
  ImGuiWindow *pIVar38;
  int n_1;
  int iVar39;
  ImVector<ImGuiViewportP_*> *this_00;
  ImGuiNavMoveResult *pIVar40;
  int n_3;
  ImGuiNavDirSourceFlags dir_sources;
  ImGuiViewportP *pIVar41;
  bool *pbVar42;
  float *pfVar43;
  long lVar44;
  ImGuiNavLayer IVar45;
  float *pfVar46;
  long lVar47;
  int i_1;
  ulong uVar48;
  int window_n;
  ImVector<ImGuiPlatformMonitor> *this_01;
  ImGuiContext *pIVar49;
  byte bVar50;
  int iVar51;
  uint uVar52;
  uint uVar53;
  int iVar54;
  uint uVar55;
  uint uVar56;
  float fVar57;
  float fVar58;
  ImVec2 IVar59;
  ImVec2 IVar60;
  ImVec2 IVar61;
  ImVec2 IVar63;
  undefined4 uVar69;
  undefined1 auVar65 [16];
  undefined4 uVar68;
  undefined1 extraout_var [12];
  undefined4 uVar70;
  undefined1 auVar66 [16];
  double dVar62;
  undefined1 auVar67 [16];
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar78;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  float fVar80;
  ImRect IVar81;
  float local_d8;
  ImRect local_b8;
  ImVec2 main_viewport_size;
  float local_78;
  ImGuiViewportP *local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 auVar64 [16];
  
  ctx = GImGui;
  bVar50 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0xf57,"void ImGui::NewFrame()");
  }
  CallContextHooks(GImGui,ImGuiContextHookType_NewFramePre);
  ctx->ConfigFlagsLastFrame = ctx->ConfigFlagsCurrFrame;
  pIVar49 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d8b,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  iVar39 = GImGui->FrameCount;
  if ((GImGui->IO).DeltaTime <= 0.0) {
    if (iVar39 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1d8c,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  else if ((iVar39 != 0) && (GImGui->FrameCountEnded != iVar39)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d8d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d8e,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar10 = (GImGui->IO).Fonts;
  if ((pIVar10->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d8f,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  ppIVar26 = ImVector<ImFont_*>::operator[](&pIVar10->Fonts,0);
  if ((*ppIVar26)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d90,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((pIVar49->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d91,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((pIVar49->Style).CircleSegmentMaxError <= 0.0) {
    __assert_fail("g.Style.CircleSegmentMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d92,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar57 = (pIVar49->Style).Alpha;
  if ((fVar57 < 0.0) || (1.0 < fVar57)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d93,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((pIVar49->Style).WindowMinSize.x < 1.0) || ((pIVar49->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d94,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (pIVar49->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d95,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar27 = 0;
  while (lVar27 != 0x16) {
    piVar6 = (pIVar49->IO).KeyMap + lVar27;
    lVar27 = lVar27 + 1;
    if (0x200 < *piVar6 + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown)))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1d97,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  uVar53 = (pIVar49->IO).ConfigFlags;
  if (((uVar53 & 1) != 0) && ((pIVar49->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d9b,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((pIVar49->IO).ConfigWindowsResizeFromEdges == true) &&
     (((pIVar49->IO).BackendFlags & 2) == 0)) {
    (pIVar49->IO).ConfigWindowsResizeFromEdges = false;
  }
  iVar39 = pIVar49->FrameCount;
  if (iVar39 == 1) {
    if (((uVar53 & 0x40) != 0) && ((pIVar49->ConfigFlagsLastFrame & 0x40) == 0)) {
      __assert_fail("0 && \"Please set DockingEnable before the first call to NewFrame()! Otherwise you will lose your .ini settings!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1da3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((uVar53 >> 10 & 1) == 0) goto LAB_00120d4b;
    if ((pIVar49->ConfigFlagsLastFrame & 0x400) == 0) {
      __assert_fail("0 && \"Please set ViewportsEnable before the first call to NewFrame()! Otherwise you will lose your .ini settings!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1da5,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  else if ((uVar53 >> 10 & 1) == 0) goto LAB_00120d4b;
  if ((~(pIVar49->IO).BackendFlags & 0x1400U) == 0) {
    if ((iVar39 != 0) && (iVar39 != pIVar49->FrameCountPlatformEnded)) {
      __assert_fail("(g.FrameCount == 0 || g.FrameCount == g.FrameCountPlatformEnded) && \"Forgot to call UpdatePlatformWindows() in main loop after EndFrame()? Check examples/ applications for reference.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1dac,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar49->PlatformIO).Platform_CreateWindow == (_func_void_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_CreateWindow != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1dad,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar49->PlatformIO).Platform_DestroyWindow == (_func_void_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_DestroyWindow != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1dae,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar49->PlatformIO).Platform_GetWindowPos == (_func_ImVec2_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_GetWindowPos != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1daf,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar49->PlatformIO).Platform_SetWindowPos == (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0) {
      __assert_fail("g.PlatformIO.Platform_SetWindowPos != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1db0,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar49->PlatformIO).Platform_GetWindowSize == (_func_ImVec2_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_GetWindowSize != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1db1,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar49->PlatformIO).Platform_SetWindowSize == (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0)
    {
      __assert_fail("g.PlatformIO.Platform_SetWindowSize != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1db2,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar49->PlatformIO).Monitors.Size < 1) {
      __assert_fail("g.PlatformIO.Monitors.Size > 0 && \"Platform init didn\'t setup Monitors list?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1db3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    ppIVar28 = ImVector<ImGuiViewportP_*>::operator[](&pIVar49->Viewports,0);
    if ((((*ppIVar28)->super_ImGuiViewport).PlatformUserData == (void *)0x0) &&
       (ppIVar28 = ImVector<ImGuiViewportP_*>::operator[](&pIVar49->Viewports,0),
       ((*ppIVar28)->super_ImGuiViewport).PlatformHandle == (void *)0x0)) {
      __assert_fail("(g.Viewports[0]->PlatformUserData != __null || g.Viewports[0]->PlatformHandle != __null) && \"Platform init didn\'t setup main viewport.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1db4,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((((pIVar49->IO).ConfigDockingTransparentPayload != false) &&
        (((pIVar49->IO).ConfigFlags & 0x40) != 0)) &&
       ((pIVar49->PlatformIO).Platform_SetWindowAlpha == (_func_void_ImGuiViewport_ptr_float *)0x0))
    {
      __assert_fail("g.PlatformIO.Platform_SetWindowAlpha != __null && \"Platform_SetWindowAlpha handler is required to use io.ConfigDockingTransparent!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1db6,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  else {
    (pIVar49->IO).ConfigFlags = uVar53 & 0xfffffbff;
  }
  this_01 = &(pIVar49->PlatformIO).Monitors;
  iVar39 = 0;
  while (iVar39 < this_01->Size) {
    pIVar29 = ImVector<ImGuiPlatformMonitor>::operator[](this_01,iVar39);
    fVar57 = (pIVar29->MainSize).x;
    if ((fVar57 <= 0.0) || (fVar71 = (pIVar29->MainSize).y, fVar71 <= 0.0)) {
      __assert_fail("mon.MainSize.x > 0.0f && mon.MainSize.y > 0.0f && \"Monitor main bounds not setup properly.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1dc2,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    fVar72 = (pIVar29->WorkPos).x;
    fVar58 = (pIVar29->WorkPos).y;
    fVar73 = (pIVar29->MainPos).x;
    if (fVar72 < fVar73) {
LAB_00123b5f:
      __assert_fail("ImRect(mon.MainPos, mon.MainPos + mon.MainSize).Contains(ImRect(mon.WorkPos, mon.WorkPos + mon.WorkSize)) && \"Monitor work bounds not setup properly. If you don\'t have work area information, just copy MainPos/MainSize into them.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1dc3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    fVar78 = (pIVar29->MainPos).y;
    uVar53 = -(uint)(fVar78 <= fVar58);
    if ((uVar53 & 1) == 0) goto LAB_00123b5f;
    iVar51 = -(uint)(fVar72 + (pIVar29->WorkSize).x <= fVar57 + fVar73);
    iVar54 = -(uint)(fVar58 + (pIVar29->WorkSize).y <= fVar71 + fVar78);
    auVar75._4_4_ = iVar51;
    auVar75._0_4_ = iVar51;
    auVar75._8_4_ = iVar54;
    auVar75._12_4_ = iVar54;
    uVar53 = movmskpd(uVar53 & 0xffff,auVar75);
    if (((uVar53 & 1) == 0) || ((byte)((byte)uVar53 >> 1) == 0)) goto LAB_00123b5f;
    iVar39 = iVar39 + 1;
    if ((pIVar29->DpiScale == 0.0) && (!NAN(pIVar29->DpiScale))) {
      __assert_fail("mon.DpiScale != 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1dc4,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
LAB_00120d4b:
  ctx->ConfigFlagsCurrFrame = (ctx->IO).ConfigFlags;
  pIVar49 = GImGui;
  if (GImGui->SettingsLoaded == false) {
    if ((GImGui->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x297c,"void ImGui::UpdateSettings()");
    }
    pcVar11 = (GImGui->IO).IniFilename;
    if (pcVar11 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar11);
    }
    pIVar49->SettingsLoaded = true;
  }
  if ((0.0 < pIVar49->SettingsDirtyTimer) &&
     (fVar57 = pIVar49->SettingsDirtyTimer - (pIVar49->IO).DeltaTime,
     pIVar49->SettingsDirtyTimer = fVar57, fVar57 <= 0.0)) {
    pcVar11 = (pIVar49->IO).IniFilename;
    if (pcVar11 == (char *)0x0) {
      (pIVar49->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar11);
    }
    pIVar49->SettingsDirtyTimer = 0.0;
  }
  ctx->Time = (double)(ctx->IO).DeltaTime + ctx->Time;
  ctx->WithinFrameScope = true;
  ctx->FrameCount = ctx->FrameCount + 1;
  ctx->TooltipOverrideCount = 0;
  ctx->WindowsActiveCount = 0;
  ImVector<unsigned_int>::resize(&ctx->MenusIdSubmittedThisFrame,0);
  fVar57 = (ctx->IO).DeltaTime;
  iVar39 = ctx->FramerateSecPerFrameIdx;
  ctx->FramerateSecPerFrameAccum =
       (fVar57 - ctx->FramerateSecPerFrame[iVar39]) + ctx->FramerateSecPerFrameAccum;
  ctx->FramerateSecPerFrame[iVar39] = fVar57;
  ctx->FramerateSecPerFrameIdx = (iVar39 + 1) % 0x78;
  uVar53 = -(uint)(0.0 < ctx->FramerateSecPerFrameAccum);
  (ctx->IO).Framerate =
       (float)(~uVar53 & 0x7f7fffff |
              (uint)(1.0 / (ctx->FramerateSecPerFrameAccum / 120.0)) & uVar53);
  pIVar49 = GImGui;
  iVar39 = (GImGui->Viewports).Size;
  if (iVar39 < (GImGui->PlatformIO).Viewports.Size) {
    __assert_fail("g.PlatformIO.Viewports.Size <= g.Viewports.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x2b74,"void ImGui::UpdateViewportsNewFrame()");
  }
  pIVar2 = &GImGui->Viewports;
  uVar53 = GImGui->ConfigFlagsCurrFrame;
  if ((uVar53 >> 10 & 1) != 0) {
    for (iVar51 = 0; iVar51 < iVar39; iVar51 = iVar51 + 1) {
      ppIVar28 = ImVector<ImGuiViewportP_*>::operator[](pIVar2,iVar51);
      p_Var12 = (pIVar49->PlatformIO).Platform_GetWindowMinimized;
      if ((p_Var12 != (_func_bool_ImGuiViewport_ptr *)0x0) &&
         (pIVar41 = *ppIVar28, pIVar41->PlatformWindowCreated == true)) {
        bVar19 = (*p_Var12)(&pIVar41->super_ImGuiViewport);
        (pIVar41->super_ImGuiViewport).Flags =
             (uint)bVar19 << 7 | (pIVar41->super_ImGuiViewport).Flags & 0xffffff7fU;
      }
      iVar39 = pIVar2->Size;
    }
  }
  ppIVar28 = ImVector<ImGuiViewportP_*>::operator[](pIVar2,0);
  pIVar41 = *ppIVar28;
  if ((pIVar41->super_ImGuiViewport).ID != 0x11111111) {
    __assert_fail("main_viewport->ID == IMGUI_VIEWPORT_DEFAULT_ID",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x2b8c,"void ImGui::UpdateViewportsNewFrame()");
  }
  if (pIVar41->Window != (ImGuiWindow *)0x0) {
    __assert_fail("main_viewport->Window == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x2b8d,"void ImGui::UpdateViewportsNewFrame()");
  }
  if ((uVar53 >> 10 & 1) == 0) {
    local_b8.Min.x = 0.0;
    local_b8.Min.y = 0.0;
    main_viewport_size = (pIVar49->IO).DisplaySize;
  }
  else {
    local_b8.Min = (*(pIVar49->PlatformIO).Platform_GetWindowPos)(&pIVar41->super_ImGuiViewport);
    main_viewport_size = (pIVar49->IO).DisplaySize;
    if (((pIVar41->super_ImGuiViewport).Flags & 0x80) != 0) {
      local_b8.Min = (pIVar41->super_ImGuiViewport).Pos;
      main_viewport_size = (pIVar41->super_ImGuiViewport).Size;
    }
  }
  uVar48 = 0;
  AddUpdateViewport((ImGuiWindow *)0x0,0x11111111,&local_b8.Min,&main_viewport_size,0x200);
  pIVar49->CurrentDpiScale = 0.0;
  this = &pIVar49->Windows;
  ppIVar28 = &pIVar49->MouseLastHoveredViewport;
  pIVar49->CurrentViewport = (ImGuiViewportP *)0x0;
  pIVar49->MouseViewport = (ImGuiViewportP *)0x0;
LAB_001211ca:
  iVar39 = (int)uVar48;
  while (iVar39 < pIVar2->Size) {
    ppIVar30 = ImVector<ImGuiViewportP_*>::operator[](pIVar2,iVar39);
    pIVar32 = *ppIVar30;
    *(int *)&(pIVar32->super_ImGuiViewport).field_0x64 = iVar39;
    if ((iVar39 == 0) || (pIVar49->FrameCount + -2 <= pIVar32->LastFrameActive)) goto LAB_001212ad;
    for (iVar51 = 0; iVar51 < this->Size; iVar51 = iVar51 + 1) {
      ppIVar31 = ImVector<ImGuiWindow_*>::operator[](this,iVar51);
      if ((*ppIVar31)->Viewport == pIVar32) {
        ppIVar31 = ImVector<ImGuiWindow_*>::operator[](this,iVar51);
        (*ppIVar31)->Viewport = (ImGuiViewportP *)0x0;
        ppIVar31 = ImVector<ImGuiWindow_*>::operator[](this,iVar51);
        (*ppIVar31)->ViewportOwned = false;
      }
    }
    if (pIVar32 == *ppIVar28) {
      *ppIVar28 = (ImGuiViewportP *)0x0;
    }
    ImVector<ImGuiViewportP_*>::erase(pIVar2,(pIVar49->Viewports).Data + uVar48);
    DestroyPlatformWindow(pIVar32);
    local_50 = pIVar32;
    bVar19 = ImVector<ImGuiViewport_*>::contains
                       (&(pIVar49->PlatformIO).Viewports,(ImGuiViewport **)&local_50);
    if (bVar19) {
      __assert_fail("g.PlatformIO.Viewports.contains(viewport) == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x2bb0,"void ImGui::UpdateViewportsNewFrame()");
    }
    IM_DELETE<ImGuiViewportP>(pIVar32);
  }
  if ((uVar53 >> 10 & 1) == 0) goto LAB_00121422;
  if (((pIVar49->IO).BackendFlags & 0x800) != 0) {
    IVar36 = (pIVar49->IO).MouseHoveredViewport;
    if ((IVar36 == 0) ||
       (pIVar32 = (ImGuiViewportP *)FindViewportByID(IVar36), pIVar32 == (ImGuiViewportP *)0x0))
    goto LAB_0012151e;
    if (((pIVar32->super_ImGuiViewport).Flags & 0x10) != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x2bfd,"void ImGui::UpdateViewportsNewFrame()");
    }
    goto LAB_00121517;
  }
  IVar59 = (pIVar49->IO).MousePos;
  this_00 = &GImGui->Viewports;
  fVar57 = IVar59.y;
  pIVar32 = (ImGuiViewportP *)0x0;
  for (iVar39 = 0; iVar39 < this_00->Size; iVar39 = iVar39 + 1) {
    ppIVar30 = ImVector<ImGuiViewportP_*>::operator[](this_00,iVar39);
    pIVar41 = *ppIVar30;
    if (((pIVar41->super_ImGuiViewport).Flags & 0x90) == 0) {
      IVar81 = ImGuiViewportP::GetMainRect(pIVar41);
      local_78 = IVar59.x;
      if (((((IVar81.Min.x <= local_78) && (IVar81.Min.y <= fVar57)) && (local_78 < IVar81.Max.x))
          && (fVar57 < IVar81.Max.y)) &&
         ((pIVar32 == (ImGuiViewportP *)0x0 ||
          (pIVar32->LastFrontMostStampCount < pIVar41->LastFrontMostStampCount)))) {
        pIVar32 = pIVar41;
      }
    }
  }
  if (pIVar32 == (ImGuiViewportP *)0x0) {
LAB_0012151e:
    pIVar41 = *ppIVar28;
    if (pIVar41 == (ImGuiViewportP *)0x0) {
      pIVar32 = (ImGuiViewportP *)0x0;
      ppIVar30 = ImVector<ImGuiViewportP_*>::operator[](pIVar2,0);
      pIVar41 = *ppIVar30;
      bVar19 = true;
      goto LAB_00121547;
    }
    bVar19 = true;
    pIVar32 = (ImGuiViewportP *)0x0;
  }
  else {
LAB_00121517:
    bVar19 = false;
    pIVar41 = pIVar32;
LAB_00121547:
    *ppIVar28 = pIVar41;
  }
  ppIVar30 = &pIVar49->MovingWindow->Viewport;
  if (pIVar49->MovingWindow == (ImGuiWindow *)0x0) {
    ppIVar30 = ppIVar28;
  }
  if (pIVar49->DragDropActive == false) {
    pIVar41 = pIVar32;
  }
  if (!bVar19) {
    pIVar41 = pIVar32;
  }
  pIVar14 = *ppIVar30;
  pIVar49->MouseViewport = pIVar14;
  if ((pIVar49->DragDropActive == false) && (pIVar49->ActiveId != 0)) {
    bVar19 = IsAnyMouseDown();
    if (((bVar19) || (pIVar32 == (ImGuiViewportP *)0x0)) || (pIVar32 == pIVar14)) goto LAB_001215bb;
LAB_001215b1:
    if (((pIVar41->super_ImGuiViewport).Flags & 0x10) != 0) goto LAB_001215bb;
LAB_00121422:
    pIVar49->MouseViewport = pIVar41;
  }
  else {
    if ((pIVar41 != (ImGuiViewportP *)0x0) && (pIVar41 != pIVar14)) goto LAB_001215b1;
LAB_001215bb:
    if (pIVar14 == (ImGuiViewportP *)0x0) {
      __assert_fail("g.MouseViewport != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x2c1f,"void ImGui::UpdateViewportsNewFrame()");
    }
  }
  ((ctx->IO).Fonts)->Locked = true;
  font = GetDefaultFont();
  SetCurrentFont(font);
  if (ctx->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0xf77,"void ImGui::NewFrame()");
  }
  pIVar2 = &ctx->Viewports;
  fVar57 = 3.4028235e+38;
  fVar71 = 3.4028235e+38;
  fVar72 = -3.4028235e+38;
  fVar58 = -3.4028235e+38;
  for (iVar39 = 0; iVar39 < pIVar2->Size; iVar39 = iVar39 + 1) {
    ppIVar28 = ImVector<ImGuiViewportP_*>::operator[](pIVar2,iVar39);
    IVar81 = ImGuiViewportP::GetMainRect(*ppIVar28);
    uVar53 = -(uint)(IVar81.Min.x < fVar57);
    uVar52 = -(uint)(IVar81.Min.y < fVar71);
    uVar55 = -(uint)(fVar72 < IVar81.Max.x);
    uVar56 = -(uint)(fVar58 < IVar81.Max.y);
    fVar57 = (float)(~uVar53 & (uint)fVar57 | (uint)IVar81.Min.x & uVar53);
    fVar71 = (float)(~uVar52 & (uint)fVar71 | (uint)IVar81.Min.y & uVar52);
    fVar72 = (float)(~uVar55 & (uint)fVar72 | (uint)IVar81.Max.x & uVar55);
    fVar58 = (float)(~uVar56 & (uint)fVar58 | (uint)IVar81.Max.y & uVar56);
  }
  (ctx->DrawListSharedData).ClipRectFullscreen.x = fVar57;
  (ctx->DrawListSharedData).ClipRectFullscreen.y = fVar71;
  (ctx->DrawListSharedData).ClipRectFullscreen.z = fVar72;
  (ctx->DrawListSharedData).ClipRectFullscreen.w = fVar58;
  fVar57 = (ctx->Style).CircleSegmentMaxError;
  (ctx->DrawListSharedData).CurveTessellationTol = (ctx->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleSegmentMaxError(&ctx->DrawListSharedData,fVar57);
  bVar19 = (ctx->Style).AntiAliasedLines;
  uVar53 = (uint)bVar19;
  (ctx->DrawListSharedData).InitialFlags = (uint)bVar19;
  if (((ctx->Style).AntiAliasedLinesUseTex != false) &&
     ((ctx->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar53 = bVar19 | 2;
    (ctx->DrawListSharedData).InitialFlags = uVar53;
  }
  if ((ctx->Style).AntiAliasedFill == true) {
    uVar53 = uVar53 | 4;
    (ctx->DrawListSharedData).InitialFlags = uVar53;
  }
  if (((ctx->IO).BackendFlags & 8) != 0) {
    (ctx->DrawListSharedData).InitialFlags = uVar53 | 8;
  }
  for (iVar39 = 0; iVar39 < pIVar2->Size; iVar39 = iVar39 + 1) {
    ppIVar28 = ImVector<ImGuiViewportP_*>::operator[](pIVar2,iVar39);
    pIVar41 = *ppIVar28;
    (pIVar41->super_ImGuiViewport).DrawData = (ImDrawData *)0x0;
    (pIVar41->DrawDataP).Valid = false;
    (pIVar41->DrawDataP).OwnerViewport = (ImGuiViewport *)0x0;
    (pIVar41->DrawDataP).DisplaySize.x = 0.0;
    (pIVar41->DrawDataP).DisplaySize.y = 0.0;
    (pIVar41->DrawDataP).FramebufferScale.x = 0.0;
    (pIVar41->DrawDataP).FramebufferScale.y = 0.0;
    (pIVar41->DrawDataP).TotalVtxCount = 0;
    (pIVar41->DrawDataP).DisplayPos.x = 0.0;
    *(undefined8 *)&(pIVar41->DrawDataP).DisplayPos.y = 0;
    (pIVar41->DrawDataP).CmdLists = (ImDrawList **)0x0;
    (pIVar41->DrawDataP).CmdListsCount = 0;
    (pIVar41->DrawDataP).TotalIdxCount = 0;
  }
  if ((ctx->DragDropActive != false) &&
     (IVar36 = (ctx->DragDropPayload).SourceId, IVar36 == ctx->ActiveId)) {
    KeepAliveID(IVar36);
  }
  if (ctx->HoveredIdPreviousFrame == 0) {
    IVar36 = ctx->HoveredId;
    ctx->HoveredIdTimer = 0.0;
    ctx->HoveredIdNotActiveTimer = 0.0;
    if (IVar36 == 0) goto LAB_0012178d;
LAB_00121762:
    fVar57 = (ctx->IO).DeltaTime;
    ctx->HoveredIdTimer = ctx->HoveredIdTimer + fVar57;
    IVar23 = IVar36;
    if (ctx->ActiveId != IVar36) {
      ctx->HoveredIdNotActiveTimer = fVar57 + ctx->HoveredIdNotActiveTimer;
      IVar23 = ctx->ActiveId;
    }
  }
  else {
    IVar36 = ctx->HoveredId;
    if (IVar36 != 0) {
      if (ctx->ActiveId == IVar36) {
        ctx->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_00121762;
    }
LAB_0012178d:
    IVar36 = 0;
    IVar23 = ctx->ActiveId;
  }
  ctx->HoveredIdPreviousFrame = IVar36;
  ctx->HoveredId = 0;
  ctx->HoveredIdAllowOverlap = false;
  ctx->HoveredIdDisabled = false;
  if (((ctx->ActiveIdIsAlive != IVar23) && (IVar23 != 0)) && (ctx->ActiveIdPreviousFrame == IVar23))
  {
    ClearActiveID();
    IVar23 = ctx->ActiveId;
  }
  fVar57 = (ctx->IO).DeltaTime;
  if (IVar23 != 0) {
    ctx->ActiveIdTimer = ctx->ActiveIdTimer + fVar57;
  }
  ctx->LastActiveIdTimer = ctx->LastActiveIdTimer + fVar57;
  ctx->ActiveIdPreviousFrame = IVar23;
  ctx->ActiveIdPreviousFrameWindow = ctx->ActiveIdWindow;
  ctx->ActiveIdPreviousFrameHasBeenEditedBefore = ctx->ActiveIdHasBeenEditedBefore;
  ctx->ActiveIdIsAlive = 0;
  ctx->ActiveIdHasBeenEditedThisFrame = false;
  ctx->ActiveIdPreviousFrameIsAlive = false;
  ctx->ActiveIdIsJustActivated = false;
  if (ctx->TempInputId == 0) {
LAB_00121873:
    if (IVar23 == 0) {
      ctx->ActiveIdUsingNavDirMask = 0;
      ctx->ActiveIdUsingNavInputMask = 0;
      ctx->ActiveIdUsingKeyInputMask = 0;
    }
  }
  else if (IVar23 != ctx->TempInputId) {
    ctx->TempInputId = 0;
    goto LAB_00121873;
  }
  ctx->DragDropAcceptIdPrev = ctx->DragDropAcceptIdCurr;
  ctx->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  ctx->DragDropAcceptIdCurr = 0;
  ctx->DragDropWithinSource = false;
  ctx->DragDropWithinTarget = false;
  ctx->DragDropHoldJustPressedId = 0;
  IVar24 = GetMergedKeyModFlags();
  (ctx->IO).KeyMods = IVar24;
  memcpy((ctx->IO).KeysDownDurationPrev,(ctx->IO).KeysDownDuration,0x800);
  for (lVar27 = 0x140; pIVar49 = GImGui, lVar27 != 0x340; lVar27 = lVar27 + 1) {
    fVar71 = -1.0;
    if (*(char *)((long)(ctx->IO).KeyMap + lVar27 + -0x3c) == '\x01') {
      fVar72 = *(float *)((long)ctx + lVar27 * 4 + -0x68);
      fVar71 = 0.0;
      if (0.0 <= fVar72) {
        fVar71 = fVar72 + fVar57;
      }
    }
    *(float *)((long)ctx + lVar27 * 4 + -0x68) = fVar71;
  }
  (GImGui->IO).WantSetMousePos = false;
  pIVar49->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  pIVar49->NavWrapRequestFlags = 0;
  uVar53 = (pIVar49->IO).ConfigFlags;
  if (((uVar53 & 2) == 0) || (((pIVar49->IO).BackendFlags & 1) == 0)) {
    bVar17 = 0;
  }
  else {
    bVar17 = 1;
    if ((pIVar49->NavInputSource != ImGuiInputSource_NavGamepad) &&
       (((bVar17 = 1, 0.0 < (pIVar49->IO).NavInputs[0] || (0.0 < (pIVar49->IO).NavInputs[2])) ||
        ((0.0 < (pIVar49->IO).NavInputs[1] ||
         ((((0.0 < (pIVar49->IO).NavInputs[3] || (0.0 < (pIVar49->IO).NavInputs[4])) ||
           (0.0 < (pIVar49->IO).NavInputs[5])) ||
          ((0.0 < (pIVar49->IO).NavInputs[6] || (0.0 < (pIVar49->IO).NavInputs[7])))))))))) {
      pIVar49->NavInputSource = ImGuiInputSource_NavGamepad;
    }
  }
  if ((uVar53 & 1) != 0) {
    bVar19 = IsKeyDown((pIVar49->IO).KeyMap[0xc]);
    if (bVar19) {
      (pIVar49->IO).NavInputs[0] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar19 = IsKeyDown((pIVar49->IO).KeyMap[0xd]);
    if (bVar19) {
      (pIVar49->IO).NavInputs[2] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar19 = IsKeyDown((pIVar49->IO).KeyMap[0xe]);
    if (bVar19) {
      (pIVar49->IO).NavInputs[1] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar19 = IsKeyDown((pIVar49->IO).KeyMap[1]);
    if (bVar19) {
      (pIVar49->IO).NavInputs[0x11] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar19 = IsKeyDown((pIVar49->IO).KeyMap[2]);
    if (bVar19) {
      (pIVar49->IO).NavInputs[0x12] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar19 = IsKeyDown((pIVar49->IO).KeyMap[3]);
    if (bVar19) {
      (pIVar49->IO).NavInputs[0x13] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar19 = IsKeyDown((pIVar49->IO).KeyMap[4]);
    if (bVar19) {
      (pIVar49->IO).NavInputs[0x14] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar19 = (pIVar49->IO).KeyCtrl;
    if (bVar19 == true) {
      (pIVar49->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar49->IO).KeyShift == true) {
      (pIVar49->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar19 == false) && ((pIVar49->IO).KeyAlt != false)) {
      (pIVar49->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar3 = (pIVar49->IO).NavInputsDownDuration;
  pfVar43 = pfVar3;
  pfVar46 = (pIVar49->IO).NavInputsDownDurationPrev;
  for (lVar27 = 0x15; lVar27 != 0; lVar27 = lVar27 + -1) {
    *pfVar46 = *pfVar43;
    pfVar43 = pfVar43 + (ulong)bVar50 * -2 + 1;
    pfVar46 = pfVar46 + (ulong)bVar50 * -2 + 1;
  }
  for (lVar27 = 0; pIVar18 = GImGui, lVar27 != 0x15; lVar27 = lVar27 + 1) {
    fVar57 = -1.0;
    if (0.0 < (pIVar49->IO).NavInputs[lVar27]) {
      fVar57 = 0.0;
      if (0.0 <= pfVar3[lVar27]) {
        fVar57 = pfVar3[lVar27] + (pIVar49->IO).DeltaTime;
      }
    }
    pfVar3[lVar27] = fVar57;
  }
  if ((pIVar49->NavInitResultId != 0) &&
     (((pIVar49->NavDisableHighlight != true || (pIVar49->NavInitRequestFromMove == true)) &&
      (GImGui->NavWindow != (ImGuiWindow *)0x0)))) {
    if (GImGui->NavInitRequestFromMove == true) {
      SetNavIDWithRectRel(GImGui->NavInitResultId,GImGui->NavLayer,0,&GImGui->NavInitResultRectRel);
    }
    else {
      SetNavID(GImGui->NavInitResultId,GImGui->NavLayer,0);
    }
    IVar59 = (pIVar18->NavInitResultRectRel).Max;
    pIVar1 = &pIVar18->NavWindow->NavRectRel[pIVar18->NavLayer].Min;
    *pIVar1 = (pIVar18->NavInitResultRectRel).Min;
    pIVar1[1] = IVar59;
  }
  pIVar49->NavInitRequest = false;
  pIVar49->NavInitRequestFromMove = false;
  pIVar49->NavInitResultId = 0;
  pIVar49->NavJustMovedToId = 0;
  pIVar18 = GImGui;
  if (pIVar49->NavMoveRequest == true) {
    IVar36 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar36 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar18->NavDisableHighlight = false;
        pIVar18->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar4 = &GImGui->NavMoveResultOther;
      pIVar40 = &GImGui->NavMoveResultLocal;
      if (IVar36 == 0) {
        pIVar40 = pIVar4;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar36 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar36 != 0)) &&
         (IVar36 != GImGui->NavId)) {
        pIVar40 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (pIVar40 == pIVar4) {
LAB_00121cec:
        pIVar40 = pIVar4;
      }
      else if (((GImGui->NavMoveResultOther).ID != 0) &&
              (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar57 = (GImGui->NavMoveResultOther).DistBox;
        fVar71 = pIVar40->DistBox;
        if (fVar71 <= fVar57) {
          if (((fVar57 != fVar71) || (NAN(fVar57) || NAN(fVar71))) ||
             (pfVar3 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar40->DistCenter < *pfVar3 || pIVar40->DistCenter == *pfVar3)) goto LAB_00121cef;
        }
        goto LAB_00121cec;
      }
LAB_00121cef:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
         (pIVar33 = pIVar40->Window, pIVar33 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x25d1,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
          IVar59 = (pIVar40->RectRel).Min;
          IVar60 = (pIVar40->RectRel).Max;
          fVar57 = (pIVar33->Pos).x;
          fVar71 = (pIVar33->Pos).y;
          local_b8.Max.x = IVar60.x + fVar57;
          local_b8.Max.y = IVar60.y + fVar71;
          local_b8.Min.y = IVar59.y + fVar71;
          local_b8.Min.x = IVar59.x + fVar57;
          IVar59 = ScrollToBringRectIntoView(pIVar40->Window,&local_b8);
        }
        else {
          fVar57 = 0.0;
          if (GImGui->NavMoveDir == 2) {
            fVar57 = (pIVar33->ScrollMax).y;
          }
          (pIVar33->ScrollTarget).y = fVar57;
          (pIVar33->ScrollTargetCenterRatio).y = 0.0;
          IVar59 = (ImVec2)((ulong)(uint)((pIVar33->Scroll).y - fVar57) << 0x20);
          (pIVar33->ScrollTargetEdgeSnapDist).y = 0.0;
        }
        fVar57 = (pIVar40->RectRel).Min.y;
        fVar71 = (pIVar40->RectRel).Max.x;
        fVar72 = (pIVar40->RectRel).Max.y;
        (pIVar40->RectRel).Min.x = (pIVar40->RectRel).Min.x - IVar59.x;
        (pIVar40->RectRel).Min.y = fVar57 - IVar59.y;
        (pIVar40->RectRel).Max.x = fVar71 - IVar59.x;
        (pIVar40->RectRel).Max.y = fVar72 - IVar59.y;
      }
      ClearActiveID();
      pIVar18->NavWindow = pIVar40->Window;
      IVar36 = pIVar40->ID;
      if (pIVar18->NavId == IVar36) {
        IVar23 = pIVar40->FocusScopeId;
      }
      else {
        pIVar18->NavJustMovedToId = IVar36;
        IVar23 = pIVar40->FocusScopeId;
        pIVar18->NavJustMovedToFocusScopeId = IVar23;
        pIVar18->NavJustMovedToKeyMods = pIVar18->NavMoveRequestKeyMods;
      }
      SetNavIDWithRectRel(IVar36,pIVar18->NavLayer,IVar23,&pIVar40->RectRel);
    }
  }
  if (pIVar49->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar49->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x24cd,"void ImGui::NavUpdate()");
    }
    if (((pIVar49->NavMoveResultLocal).ID == 0) && ((pIVar49->NavMoveResultOther).ID == 0)) {
      pIVar49->NavDisableHighlight = false;
    }
    pIVar49->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar49->NavMousePosDirty == true) && (pIVar49->NavIdIsAlive == true)) {
    if ((((pIVar49->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar49->IO).BackendFlags & 4) != 0 && (pIVar49->NavDisableHighlight == false)) &&
         (pIVar49->NavDisableMouseHover == true)) && (pIVar49->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar59 = NavCalcPreferredRefPos();
      (pIVar49->IO).MousePosPrev = IVar59;
      (pIVar49->IO).MousePos = IVar59;
      (pIVar49->IO).WantSetMousePos = true;
    }
    pIVar49->NavMousePosDirty = false;
  }
  pIVar49->NavIdIsAlive = false;
  pIVar49->NavJustTabbedId = 0;
  IVar45 = pIVar49->NavLayer;
  if (ImGuiNavLayer_Menu < IVar45) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x24e3,"void ImGui::NavUpdate()");
  }
  pIVar33 = pIVar49->NavWindow;
  pIVar38 = pIVar33;
  if (pIVar33 != (ImGuiWindow *)0x0) {
    for (; pIVar38 != (ImGuiWindow *)0x0; pIVar38 = pIVar38->ParentWindow) {
      if ((pIVar38->RootWindowDockStop == pIVar38) || ((pIVar38->Flags & 0x15000000U) != 0x1000000))
      {
        if (pIVar38 != pIVar33) {
          pIVar38->NavLastChildNavWindow = pIVar33;
        }
        break;
      }
    }
    if ((IVar45 == ImGuiNavLayer_Main) && (pIVar33->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar33->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar18 = GImGui;
  pIVar33 = GetTopMostPopupModal();
  if (pIVar33 != (ImGuiWindow *)0x0) {
    pIVar18->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar18->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar57 = (pIVar18->IO).DeltaTime * -10.0 + pIVar18->NavWindowingHighlightAlpha;
    fVar57 = (float)(-(uint)(0.0 <= fVar57) & (uint)fVar57);
    pIVar18->NavWindowingHighlightAlpha = fVar57;
    if ((pIVar18->DimBgRatio <= 0.0) && (fVar57 <= 0.0)) {
      pIVar18->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar33 == (ImGuiWindow *)0x0) && (pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    bVar19 = IsNavInputTest(3,ImGuiInputReadMode_Pressed);
    if ((pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0) &&
       (((pIVar18->IO).KeyCtrl == true && (bVar20 = IsKeyPressedMap(0,true), bVar20)))) {
      bVar50 = (byte)(pIVar18->IO).ConfigFlags;
      uVar52 = (uint)bVar50;
      if (bVar19 || (bVar50 & 1) != 0) {
LAB_00121fda:
        pIVar33 = pIVar18->NavWindow;
        if ((pIVar33 != (ImGuiWindow *)0x0) ||
           (pIVar33 = FindWindowNavFocusable((pIVar18->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
           pIVar33 != (ImGuiWindow *)0x0)) {
          pIVar33 = pIVar33->RootWindowDockStop;
          pIVar18->NavWindowingTargetAnim = pIVar33;
          pIVar18->NavWindowingTarget = pIVar33;
          pIVar18->NavWindowingTimer = 0.0;
          pIVar18->NavWindowingHighlightAlpha = 0.0;
          pIVar18->NavWindowingToggleLayer = (bool)(~(byte)uVar52 & 1);
          pIVar18->NavInputSource = ImGuiInputSource_NavGamepad - (uVar52 & 1);
        }
      }
    }
    else if (bVar19) {
      uVar52 = 0;
      goto LAB_00121fda;
    }
  }
  fVar57 = (pIVar18->IO).DeltaTime + pIVar18->NavWindowingTimer;
  pIVar18->NavWindowingTimer = fVar57;
  if (pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0) {
LAB_001221cd:
    bVar19 = false;
    pIVar33 = (ImGuiWindow *)0x0;
  }
  else {
    IVar25 = pIVar18->NavInputSource;
    if (IVar25 != ImGuiInputSource_NavGamepad) {
LAB_0012213b:
      if (IVar25 == ImGuiInputSource_NavKeyboard) {
        fVar71 = (pIVar18->NavWindowingTimer + -0.2) / 0.05;
        fVar57 = 1.0;
        if (fVar71 <= 1.0) {
          fVar57 = fVar71;
        }
        fVar57 = (float)(~-(uint)(fVar71 < 0.0) & (uint)fVar57);
        uVar52 = -(uint)(fVar57 <= pIVar18->NavWindowingHighlightAlpha);
        pIVar18->NavWindowingHighlightAlpha =
             (float)(uVar52 & (uint)pIVar18->NavWindowingHighlightAlpha | ~uVar52 & (uint)fVar57);
        bVar19 = IsKeyPressedMap(0,true);
        if (bVar19) {
          NavUpdateWindowingHighlightWindow((pIVar18->IO).KeyShift - 1 | 1);
        }
        if ((pIVar18->IO).KeyCtrl == false) {
          pIVar33 = pIVar18->NavWindowingTarget;
          bVar19 = false;
          goto LAB_001221d2;
        }
      }
      goto LAB_001221cd;
    }
    fVar71 = (fVar57 + -0.2) / 0.05;
    fVar57 = 1.0;
    if (fVar71 <= 1.0) {
      fVar57 = fVar71;
    }
    fVar57 = (float)(~-(uint)(fVar71 < 0.0) & (uint)fVar57);
    uVar52 = -(uint)(fVar57 <= pIVar18->NavWindowingHighlightAlpha);
    pIVar18->NavWindowingHighlightAlpha =
         (float)(uVar52 & (uint)pIVar18->NavWindowingHighlightAlpha | ~uVar52 & (uint)fVar57);
    bVar19 = IsNavInputTest(0xc,ImGuiInputReadMode_RepeatSlow);
    bVar20 = IsNavInputTest(0xd,ImGuiInputReadMode_RepeatSlow);
    if ((uint)bVar19 - (uint)bVar20 != 0) {
      NavUpdateWindowingHighlightWindow((uint)bVar19 - (uint)bVar20);
      pIVar18->NavWindowingHighlightAlpha = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) {
      if (pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_001221cd;
      IVar25 = pIVar18->NavInputSource;
      goto LAB_0012213b;
    }
    pbVar42 = &pIVar18->NavWindowingToggleLayer;
    *pbVar42 = (bool)(*pbVar42 &
                     (pIVar18->NavWindowingHighlightAlpha <= 1.0 &&
                     pIVar18->NavWindowingHighlightAlpha != 1.0));
    if (*pbVar42 == false) {
      pIVar33 = pIVar18->NavWindowingTarget;
      bVar19 = false;
    }
    else {
      bVar19 = pIVar18->NavWindow != (ImGuiWindow *)0x0;
      pIVar33 = (ImGuiWindow *)0x0;
    }
    pIVar18->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_001221d2:
  dir_sources = 1;
  bVar20 = IsNavInputTest(0x10,ImGuiInputReadMode_Pressed);
  if (bVar20) {
    pIVar18->NavWindowingToggleLayer = true;
  }
  if ((((pIVar18->ActiveId == 0) || (pIVar18->ActiveIdAllowOverlap == true)) &&
      (pIVar18->NavWindowingToggleLayer == true)) &&
     (bVar20 = IsNavInputTest(0x10,ImGuiInputReadMode_Released), bVar20)) {
    bVar20 = IsMousePosValid(&(pIVar18->IO).MousePos);
    bVar21 = IsMousePosValid(&(pIVar18->IO).MousePosPrev);
    bVar19 = (bool)(bVar21 == bVar20 | bVar19);
  }
  pIVar38 = pIVar18->NavWindowingTarget;
  if ((pIVar38 != (ImGuiWindow *)0x0) && ((pIVar38->Flags & 4) == 0)) {
    if (pIVar18->NavInputSource == ImGuiInputSource_NavGamepad) {
      dir_sources = 4;
LAB_001222ba:
      IVar59 = GetNavInputAmount2d(dir_sources,ImGuiInputReadMode_Down,0.0,0.0);
    }
    else {
      IVar59.x = 0.0;
      IVar59.y = 0.0;
      if ((pIVar18->NavInputSource == ImGuiInputSource_NavKeyboard) &&
         ((pIVar18->IO).KeyShift == false)) goto LAB_001222ba;
    }
    fVar57 = IVar59.x;
    fVar71 = IVar59.y;
    if ((((fVar57 != 0.0) || (NAN(fVar57))) || (fVar71 != 0.0)) || (NAN(fVar71))) {
      fVar72 = (pIVar18->IO).DisplayFramebufferScale.x;
      fVar58 = (pIVar18->IO).DisplayFramebufferScale.y;
      if (fVar58 <= fVar72) {
        fVar72 = fVar58;
      }
      fVar72 = (float)(int)(fVar72 * (pIVar18->IO).DeltaTime * 800.0);
      pIVar38 = pIVar38->RootWindow;
      local_b8.Min.y = (pIVar38->Pos).y + fVar71 * fVar72;
      local_b8.Min.x = (pIVar38->Pos).x + fVar57 * fVar72;
      SetWindowPos(pIVar38,&local_b8.Min,1);
      MarkIniSettingsDirty(pIVar38);
      pIVar18->NavDisableMouseHover = true;
    }
  }
  if (pIVar33 != (ImGuiWindow *)0x0) {
    pIVar38 = pIVar18->NavWindow;
    if (pIVar38 == (ImGuiWindow *)0x0) {
      pIVar41 = (ImGuiViewportP *)0x0;
LAB_00122371:
      ClearActiveID();
      pIVar18->NavDisableHighlight = false;
      pIVar18->NavDisableMouseHover = true;
      pIVar33 = NavRestoreLastChildNavWindow(pIVar33);
      ClosePopupsOverWindow(pIVar33,false);
      FocusWindow(pIVar33);
      if (pIVar33->NavLastIds[0] == 0) {
        NavInitWindow(pIVar33,false);
      }
      if ((pIVar33->DC).NavLayerActiveMask == 2) {
        pIVar18->NavLayer = ImGuiNavLayer_Menu;
      }
      if ((pIVar33->Viewport != pIVar41) &&
         (p_Var15 = (pIVar18->PlatformIO).Platform_SetWindowFocus,
         p_Var15 != (_func_void_ImGuiViewport_ptr *)0x0)) {
        (*p_Var15)(&pIVar33->Viewport->super_ImGuiViewport);
      }
    }
    else if (pIVar33 != pIVar38->RootWindowDockStop) {
      pIVar41 = pIVar38->Viewport;
      goto LAB_00122371;
    }
    pIVar18->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar19) && (pIVar33 = pIVar18->NavWindow, pIVar38 = pIVar33, pIVar33 != (ImGuiWindow *)0x0))
  {
    while (window = pIVar38, window->ParentWindow != (ImGuiWindow *)0x0) {
      if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
         (pIVar38 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
    }
    if (window != pIVar33) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar33;
      pIVar33 = pIVar18->NavWindow;
    }
    pIVar18->NavDisableHighlight = false;
    pIVar18->NavDisableMouseHover = true;
    IVar45 = ImGuiNavLayer_Main;
    if (((pIVar33->DC).NavLayerActiveMask & 2) != 0) {
      if (pIVar18->NavLayer == ImGuiNavLayer_Main) {
        IVar45 = ImGuiNavLayer_Menu;
        if (window->DockNodeAsHost == (ImGuiDockNode *)0x0) {
          pIVar33->NavLastIds[1] = 0;
        }
      }
      else {
        IVar45 = pIVar18->NavLayer ^ ImGuiNavLayer_Menu;
      }
    }
    NavRestoreLayer(IVar45);
  }
  if (((bool)((uVar53 & 1) == 0 & (bVar17 ^ 1))) || (pIVar49->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar49->IO).NavActive = false;
LAB_00122525:
    bVar19 = pIVar49->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar19 = (pIVar49->NavWindow->Flags & 0x40000U) == 0;
    (pIVar49->IO).NavActive = bVar19;
    if (((!bVar19) || (pIVar49->NavId == 0)) ||
       (bVar19 = true, pIVar49->NavDisableHighlight != false)) goto LAB_00122525;
  }
  (pIVar49->IO).NavVisible = bVar19;
  bVar19 = IsNavInputTest(1,ImGuiInputReadMode_Pressed);
  if (bVar19) {
    if (pIVar49->ActiveId == 0) {
      pIVar33 = pIVar49->NavWindow;
      if (((pIVar33 == (ImGuiWindow *)0x0) || ((pIVar33->Flags & 0x5000000U) != 0x1000000)) ||
         ((pIVar33->ParentWindow == (ImGuiWindow *)0x0 || (pIVar33 == pIVar33->RootWindowDockStop)))
         ) {
        if ((pIVar49->OpenPopupStack).Size < 1) {
          if (pIVar49->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar33 != (ImGuiWindow *)0x0) && ((pIVar33->Flags & 0x5000000U) != 0x1000000)) {
              pIVar33->NavLastIds[0] = 0;
            }
            pIVar49->NavId = 0;
            pIVar49->NavFocusScopeId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else {
          pIVar34 = ImVector<ImGuiPopupData>::back(&pIVar49->OpenPopupStack);
          if ((pIVar34->Window->Flags & 0x8000000) == 0) {
            ClosePopupToLevel((pIVar49->OpenPopupStack).Size + -1,true);
          }
        }
      }
      else {
        if (pIVar33->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x2500,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar33->ParentWindow);
        SetNavID(pIVar33->ChildId,0,0);
        pIVar49->NavIdIsAlive = false;
        if (pIVar49->NavDisableMouseHover == true) {
          pIVar49->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar49->NavActivateId = 0;
  pIVar49->NavActivateDownId = 0;
  pIVar49->NavActivatePressedId = 0;
  pIVar49->NavInputId = 0;
  if (((pIVar49->NavId == 0) || (pIVar49->NavDisableHighlight != false)) ||
     (pIVar49->NavWindowingTarget != (ImGuiWindow *)0x0)) {
LAB_00122676:
    pIVar33 = pIVar49->NavWindow;
    if (pIVar33 == (ImGuiWindow *)0x0) goto LAB_001226db;
    if ((pIVar33->Flags & 0x40000) != 0) {
      pIVar49->NavDisableHighlight = true;
    }
    bVar19 = false;
  }
  else {
    if (pIVar49->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar49->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          bVar19 = IsNavInputTest(0,ImGuiInputReadMode_Pressed);
          IVar36 = pIVar49->ActiveId;
          IVar23 = pIVar49->NavId;
          if (IVar36 == 0 && bVar19) {
            pIVar49->NavActivateId = IVar23;
            pIVar49->NavActivateDownId = IVar23;
LAB_00122a7e:
            pIVar49->NavActivatePressedId = IVar23;
          }
          else if (IVar36 == 0) {
            pIVar49->NavActivateDownId = IVar23;
            if (bVar19) goto LAB_00122a7e;
          }
          else {
            bVar20 = IVar36 == IVar23;
            if (!bVar20) goto LAB_00122676;
            pIVar49->NavActivateDownId = IVar36;
            IVar23 = IVar36;
            if (bVar19 && bVar20) goto LAB_00122a7e;
          }
LAB_00122a85:
          bVar19 = IsNavInputTest(2,ImGuiInputReadMode_Pressed);
          if (bVar19) {
            pIVar49->NavInputId = pIVar49->NavId;
          }
        }
        else if (pIVar49->ActiveId == pIVar49->NavId || pIVar49->ActiveId == 0) goto LAB_00122a85;
      }
      goto LAB_00122676;
    }
LAB_001226db:
    bVar19 = true;
    pIVar33 = (ImGuiWindow *)0x0;
  }
  IVar36 = pIVar49->NavActivateId;
  if ((IVar36 != 0) && (pIVar49->NavActivateDownId != IVar36)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x252e,"void ImGui::NavUpdate()");
  }
  pIVar49->NavMoveRequest = false;
  IVar36 = pIVar49->NavNextActivateId;
  if (IVar36 != 0) {
    pIVar49->NavActivateId = IVar36;
    pIVar49->NavActivateDownId = IVar36;
    pIVar49->NavActivatePressedId = IVar36;
    pIVar49->NavInputId = IVar36;
  }
  pIVar49->NavNextActivateId = 0;
  if (pIVar49->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar49->NavMoveDir = -1;
    pIVar49->NavMoveRequestFlags = 0;
    if (((!bVar19) && (pIVar49->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar33->Flags & 0x40000) == 0)) {
      if (((GImGui->ActiveIdUsingNavDirMask & 1) == 0) &&
         ((bVar19 = IsNavInputTest(4,ImGuiInputReadMode_Repeat), bVar19 ||
          (bVar19 = IsNavInputTest(0x11,ImGuiInputReadMode_Repeat), bVar19)))) {
        pIVar49->NavMoveDir = 0;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 2) == 0) &&
         ((bVar19 = IsNavInputTest(5,ImGuiInputReadMode_Repeat), bVar19 ||
          (bVar19 = IsNavInputTest(0x12,ImGuiInputReadMode_Repeat), bVar19)))) {
        pIVar49->NavMoveDir = 1;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 4) == 0) &&
         ((bVar19 = IsNavInputTest(6,ImGuiInputReadMode_Repeat), bVar19 ||
          (bVar19 = IsNavInputTest(0x13,ImGuiInputReadMode_Repeat), bVar19)))) {
        pIVar49->NavMoveDir = 2;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 8) == 0) &&
         ((bVar19 = IsNavInputTest(7,ImGuiInputReadMode_Repeat), bVar19 ||
          (bVar19 = IsNavInputTest(0x14,ImGuiInputReadMode_Repeat), bVar19)))) {
        pIVar49->NavMoveDir = 3;
      }
    }
    pIVar49->NavMoveClipDir = pIVar49->NavMoveDir;
  }
  else {
    if ((pIVar49->NavMoveDir == -1) || (pIVar49->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x2549,"void ImGui::NavUpdate()");
    }
    if (pIVar49->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x254a,"void ImGui::NavUpdate()");
    }
    pIVar49->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar18 = GImGui;
  fVar57 = 0.0;
  if ((((((uVar53 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
       (pIVar33 = GImGui->NavWindow, pIVar33 != (ImGuiWindow *)0x0)) &&
      (((pIVar33->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    bVar19 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar21 = false;
    bVar20 = false;
    if (bVar19) {
      bVar20 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    bVar19 = IsKeyDown((pIVar18->IO).KeyMap[6]);
    if (bVar19) {
      bVar21 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar19 = IsKeyPressed((pIVar18->IO).KeyMap[7],true);
    if (bVar19) {
      bVar19 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar19 = false;
    }
    bVar22 = IsKeyPressed((pIVar18->IO).KeyMap[8],true);
    if (bVar22) {
      bVar22 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar22 = false;
    }
    fVar57 = 0.0;
    if ((bVar20 != bVar21) || (bVar19 != bVar22)) {
      if (((pIVar33->DC).NavLayerActiveMask == 0) && ((pIVar33->DC).NavHasScroll == true)) {
        bVar20 = IsKeyPressed((pIVar18->IO).KeyMap[5],true);
        if (bVar20) {
          fVar57 = (pIVar33->Scroll).y - ((pIVar33->InnerRect).Max.y - (pIVar33->InnerRect).Min.y);
LAB_00123afe:
          (pIVar33->ScrollTarget).y = fVar57;
        }
        else {
          bVar20 = IsKeyPressed((pIVar18->IO).KeyMap[6],true);
          if (bVar20) {
            fVar57 = ((pIVar33->InnerRect).Max.y - (pIVar33->InnerRect).Min.y) + (pIVar33->Scroll).y
            ;
            goto LAB_00123afe;
          }
          if (bVar19 == false) {
            if (bVar22 == false) goto LAB_00123b17;
            fVar57 = (pIVar33->ScrollMax).y;
            goto LAB_00123afe;
          }
          (pIVar33->ScrollTarget).y = 0.0;
        }
        (pIVar33->ScrollTargetCenterRatio).y = 0.0;
        (pIVar33->ScrollTargetEdgeSnapDist).y = 0.0;
LAB_00123b17:
        fVar57 = 0.0;
      }
      else {
        IVar45 = pIVar18->NavLayer;
        fVar57 = (pIVar33->InnerRect).Max.y;
        fVar71 = (pIVar33->InnerRect).Min.y;
        fVar72 = ImGuiWindow::CalcFontSize(pIVar33);
        fVar57 = (pIVar33->NavRectRel[IVar45].Max.y - pIVar33->NavRectRel[IVar45].Min.y) +
                 ((fVar57 - fVar71) - fVar72);
        fVar57 = (float)(~-(uint)(fVar57 <= 0.0) & (uint)fVar57);
        bVar20 = IsKeyPressed((pIVar18->IO).KeyMap[5],true);
        if (bVar20) {
          fVar57 = -fVar57;
          pIVar18->NavMoveDir = 3;
          pIVar18->NavMoveClipDir = 2;
          pIVar18->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar20 = IsKeyPressed((pIVar18->IO).KeyMap[6],true);
          if (!bVar20) {
            pIVar35 = pIVar33->NavRectRel + IVar45;
            if (bVar19 == false) {
              fVar57 = 0.0;
              if (bVar22 != false) {
                fVar71 = ((pIVar33->ScrollMax).y + (pIVar33->SizeFull).y) - (pIVar33->Scroll).y;
                pIVar33->NavRectRel[IVar45].Max.y = fVar71;
                pIVar33->NavRectRel[IVar45].Min.y = fVar71;
                fVar71 = (pIVar35->Min).x;
                pIVar1 = &pIVar33->NavRectRel[IVar45].Max;
                if (pIVar1->x <= fVar71 && fVar71 != pIVar1->x) {
                  pIVar33->NavRectRel[IVar45].Max.x = 0.0;
                  (pIVar35->Min).x = 0.0;
                }
                pIVar18->NavMoveDir = 2;
                pIVar18->NavMoveRequestFlags = 0x50;
              }
              goto LAB_00122896;
            }
            fVar57 = -(pIVar33->Scroll).y;
            pIVar33->NavRectRel[IVar45].Max.y = fVar57;
            pIVar33->NavRectRel[IVar45].Min.y = fVar57;
            fVar57 = (pIVar35->Min).x;
            pIVar1 = &pIVar33->NavRectRel[IVar45].Max;
            if (pIVar1->x <= fVar57 && fVar57 != pIVar1->x) {
              pIVar33->NavRectRel[IVar45].Max.x = 0.0;
              (pIVar35->Min).x = 0.0;
            }
            pIVar18->NavMoveDir = 3;
            pIVar18->NavMoveRequestFlags = 0x50;
            goto LAB_00123b17;
          }
          pIVar18->NavMoveDir = 2;
          pIVar18->NavMoveClipDir = 3;
          pIVar18->NavMoveRequestFlags = 0x30;
        }
      }
    }
  }
LAB_00122896:
  if (pIVar49->NavMoveDir == -1) {
    if ((pIVar49->NavMoveRequest & 1U) != 0) goto LAB_001228cf;
  }
  else {
    pIVar49->NavMoveRequest = true;
    pIVar49->NavMoveRequestKeyMods = (pIVar49->IO).KeyMods;
    pIVar49->NavMoveDirLast = pIVar49->NavMoveDir;
LAB_001228cf:
    if (pIVar49->NavId == 0) {
      pIVar49->NavInitRequest = true;
      pIVar49->NavInitRequestFromMove = true;
      pIVar49->NavInitResultId = 0;
      pIVar49->NavDisableHighlight = false;
    }
  }
  NavUpdateAnyRequestFlag();
  pIVar33 = pIVar49->NavWindow;
  if (((pIVar33 != (ImGuiWindow *)0x0) && ((pIVar33->Flags & 0x40000) == 0)) &&
     (pIVar49->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar71 = ImGuiWindow::CalcFontSize(pIVar33);
    fVar71 = (float)(int)(fVar71 * 100.0 * (pIVar49->IO).DeltaTime + 0.5);
    if ((((pIVar33->DC).NavLayerActiveMask == 0) && ((pIVar33->DC).NavHasScroll == true)) &&
       (pIVar49->NavMoveRequest == true)) {
      uVar53 = pIVar49->NavMoveDir;
      if (uVar53 < 2) {
        lVar27 = 0xac;
        lVar37 = 0xa4;
        lVar44 = 0x9c;
        uVar52 = 0;
        lVar47 = 0x8c;
      }
      else {
        if ((uVar53 & 0xfffffffe) != 2) goto LAB_00122b21;
        uVar52 = 2;
        lVar27 = 0xb0;
        lVar37 = 0xa8;
        lVar44 = 0xa0;
        lVar47 = 0x90;
      }
      *(float *)((long)&pIVar33->Name + lVar44) =
           (float)(int)(*(float *)(&DAT_0018f42c + (ulong)(uVar53 == uVar52) * 4) * fVar71 +
                       *(float *)((long)&pIVar33->Name + lVar47));
      *(undefined4 *)((long)&pIVar33->Name + lVar37) = 0;
      *(undefined4 *)((long)&pIVar33->Name + lVar27) = 0;
    }
LAB_00122b21:
    IVar59 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar72 = IVar59.x;
    fVar58 = IVar59.y;
    if (((fVar72 != 0.0) || (NAN(fVar72))) && (pIVar33->ScrollbarX == true)) {
      (pIVar33->ScrollTarget).x = (float)(int)(fVar72 * fVar71 + (pIVar33->Scroll).x);
      (pIVar33->ScrollTargetCenterRatio).x = 0.0;
      (pIVar33->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    if ((fVar58 != 0.0) || (NAN(fVar58))) {
      (pIVar33->ScrollTarget).y = (float)(int)(fVar58 * fVar71 + (pIVar33->Scroll).y);
      (pIVar33->ScrollTargetCenterRatio).y = 0.0;
      (pIVar33->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  (pIVar49->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar49->NavMoveResultLocal).ID = 0;
  (pIVar49->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar49->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar49->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar49->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar49->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar49->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar49->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar49->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar49->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar49->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar49->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar49->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar49->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar49->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar49->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar49->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar49->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar49->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar49->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar49->NavMoveResultOther).ID = 0;
  (pIVar49->NavMoveResultOther).FocusScopeId = 0;
  (pIVar49->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar49->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar49->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar49->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar49->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar49->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar49->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((pIVar49->NavMoveRequest == true) && (pIVar49->NavInputSource == ImGuiInputSource_NavGamepad)
      ) && (pIVar49->NavLayer == ImGuiNavLayer_Main)) {
    pIVar33 = pIVar49->NavWindow;
    IVar59 = (pIVar33->InnerRect).Min;
    fVar71 = (pIVar33->Pos).x;
    fVar72 = (pIVar33->Pos).y;
    IVar60 = (pIVar33->InnerRect).Max;
    local_b8.Max.x = (IVar60.x - fVar71) + 1.0;
    local_b8.Max.y = (IVar60.y - fVar72) + 1.0;
    local_b8.Min.y = (IVar59.y - fVar72) + -1.0;
    local_b8.Min.x = (IVar59.x - fVar71) + -1.0;
    bVar19 = ImRect::Contains(&local_b8,pIVar33->NavRectRel);
    if (!bVar19) {
      fVar71 = ImGuiWindow::CalcFontSize(pIVar33);
      auVar66._0_4_ = fVar71 * 0.5;
      auVar74._0_4_ = local_b8.Max.x - local_b8.Min.x;
      auVar74._4_4_ = local_b8.Max.y - local_b8.Min.y;
      auVar74._8_4_ = local_b8.Max.x - local_b8.Max.x;
      auVar74._12_4_ = local_b8.Max.y - local_b8.Max.y;
      auVar66._4_4_ = auVar66._0_4_;
      auVar66._8_4_ = auVar66._0_4_;
      auVar66._12_4_ = auVar66._0_4_;
      auVar75 = minps(auVar74,auVar66);
      local_b8.Max.x = local_b8.Max.x - auVar75._0_4_;
      local_b8.Max.y = local_b8.Max.y - auVar75._4_4_;
      local_b8.Min.y = auVar75._4_4_ + local_b8.Min.y;
      local_b8.Min.x = auVar75._0_4_ + local_b8.Min.x;
      ImRect::ClipWithFull(pIVar33->NavRectRel + pIVar49->NavLayer,&local_b8);
      pIVar49->NavId = 0;
      pIVar49->NavFocusScopeId = 0;
    }
  }
  pIVar33 = pIVar49->NavWindow;
  if (pIVar33 == (ImGuiWindow *)0x0) {
    fVar71 = 0.0;
    fVar58 = 0.0;
    fVar73 = 0.0;
    fVar72 = 1.0;
  }
  else {
    IVar45 = pIVar49->NavLayer;
    fVar72 = pIVar33->NavRectRel[IVar45].Min.x;
    fVar78 = pIVar33->NavRectRel[IVar45].Max.x;
    fVar58 = 0.0;
    if (fVar78 < fVar72) {
      fVar73 = 0.0;
      fVar80 = 0.0;
      fVar71 = 0.0;
    }
    else {
      fVar8 = pIVar33->NavRectRel[IVar45].Min.y;
      fVar9 = pIVar33->NavRectRel[IVar45].Max.y;
      fVar71 = 0.0;
      fVar80 = 0.0;
      fVar73 = 0.0;
      if (fVar8 <= fVar9) {
        fVar71 = fVar8;
        fVar80 = fVar72;
        fVar58 = fVar9;
        fVar73 = fVar78;
      }
    }
    fVar72 = (pIVar33->Pos).x;
    fVar78 = (pIVar33->Pos).y;
    fVar71 = fVar71 + fVar78;
    fVar73 = fVar73 + fVar72;
    fVar58 = fVar58 + fVar78;
    fVar72 = fVar80 + fVar72 + 1.0;
  }
  if (fVar73 <= fVar72) {
    fVar72 = fVar73;
  }
  (pIVar49->NavScoringRect).Min.y = fVar71 + fVar57;
  (pIVar49->NavScoringRect).Max.y = fVar58 + fVar57;
  (pIVar49->NavScoringRect).Min.x = fVar72;
  (pIVar49->NavScoringRect).Max.x = fVar72;
  if (fVar58 + fVar57 < fVar71 + fVar57) {
    __assert_fail("!g.NavScoringRect.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x2599,"void ImGui::NavUpdate()");
  }
  pIVar49->NavScoringCount = 0;
  pIVar49 = GImGui;
  pIVar1 = &(GImGui->IO).MousePos;
  bVar19 = IsMousePosValid(pIVar1);
  if (bVar19) {
    IVar59 = (pIVar49->IO).MousePos;
    IVar60.x = (float)(int)IVar59.x;
    IVar60.y = (float)(int)IVar59.y;
    pIVar49->LastValidMousePos = IVar60;
    (pIVar49->IO).MousePos = IVar60;
  }
  bVar19 = IsMousePosValid(pIVar1);
  if ((bVar19) && (bVar19 = IsMousePosValid(&(pIVar49->IO).MousePosPrev), bVar19)) {
    IVar59 = (pIVar49->IO).MousePos;
    IVar60 = (pIVar49->IO).MousePosPrev;
    IVar61.x = IVar59.x - IVar60.x;
    IVar61.y = IVar59.y - IVar60.y;
    (pIVar49->IO).MouseDelta = IVar61;
    if (((IVar61.x != 0.0) || (NAN(IVar61.x))) || ((IVar61.y != 0.0 || (NAN(IVar61.y))))) {
      pIVar49->NavDisableMouseHover = false;
    }
  }
  else {
    (pIVar49->IO).MouseDelta.x = 0.0;
    (pIVar49->IO).MouseDelta.y = 0.0;
  }
  (pIVar49->IO).MousePosPrev = (pIVar49->IO).MousePos;
  for (lVar27 = 0; lVar27 != 5; lVar27 = lVar27 + 1) {
    if ((pIVar49->IO).MouseDown[lVar27] == true) {
      fVar57 = (pIVar49->IO).MouseDownDuration[lVar27];
      pbVar42 = (pIVar49->IO).MouseClicked + lVar27;
      *pbVar42 = fVar57 < 0.0;
      pbVar42[10] = false;
      (pIVar49->IO).MouseDownDurationPrev[lVar27] = fVar57;
      if (0.0 <= fVar57) {
        (pIVar49->IO).MouseDownDuration[lVar27] = fVar57 + (pIVar49->IO).DeltaTime;
        (pIVar49->IO).MouseDoubleClicked[lVar27] = false;
        bVar19 = IsMousePosValid(pIVar1);
        auVar67 = ZEXT816(0);
        if (bVar19) {
          IVar59 = (pIVar49->IO).MousePos;
          IVar60 = (pIVar49->IO).MouseClickedPos[lVar27];
          auVar67._0_4_ = IVar59.x - IVar60.x;
          auVar67._4_4_ = IVar59.y - IVar60.y;
          auVar67._8_8_ = 0;
        }
        fVar57 = (pIVar49->IO).MouseDragMaxDistanceSqr[lVar27];
        fVar71 = auVar67._0_4_ * auVar67._0_4_ + auVar67._4_4_ * auVar67._4_4_;
        uVar53 = -(uint)(fVar71 <= fVar57);
        (pIVar49->IO).MouseDragMaxDistanceSqr[lVar27] =
             (float)(~uVar53 & (uint)fVar71 | (uint)fVar57 & uVar53);
        IVar59 = (pIVar49->IO).MouseDragMaxDistanceAbs[lVar27];
        fVar57 = IVar59.x;
        fVar71 = IVar59.y;
        auVar76._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
        auVar76._8_4_ = auVar67._8_4_ ^ 0x80000000;
        auVar76._12_4_ = auVar67._12_4_ ^ 0x80000000;
        auVar75 = maxps(auVar76,auVar67);
        uVar53 = -(uint)(auVar75._0_4_ <= fVar57);
        uVar52 = -(uint)(auVar75._4_4_ <= fVar71);
        (pIVar49->IO).MouseDragMaxDistanceAbs[lVar27] =
             (ImVec2)(CONCAT44(~uVar52 & (uint)auVar75._4_4_,~uVar53 & (uint)auVar75._0_4_) |
                     CONCAT44((uint)fVar71 & uVar52,(uint)fVar57 & uVar53));
      }
      else {
        (pIVar49->IO).MouseDownDuration[lVar27] = 0.0;
        (pIVar49->IO).MouseDoubleClicked[lVar27] = false;
        dVar62 = pIVar49->Time;
        if ((float)(dVar62 - (pIVar49->IO).MouseClickedTime[lVar27]) <
            (pIVar49->IO).MouseDoubleClickTime) {
          bVar19 = IsMousePosValid(pIVar1);
          fVar57 = 0.0;
          fVar71 = 0.0;
          if (bVar19) {
            IVar59 = (pIVar49->IO).MousePos;
            IVar60 = (pIVar49->IO).MouseClickedPos[lVar27];
            fVar57 = IVar59.x - IVar60.x;
            fVar71 = IVar59.y - IVar60.y;
          }
          fVar72 = (pIVar49->IO).MouseDoubleClickMaxDist;
          if (fVar57 * fVar57 + fVar71 * fVar71 < fVar72 * fVar72) {
            (pIVar49->IO).MouseDoubleClicked[lVar27] = true;
          }
          dVar62 = (double)((pIVar49->IO).MouseDoubleClickTime * -2.0);
        }
        (pIVar49->IO).MouseClickedTime[lVar27] = dVar62;
        (pIVar49->IO).MouseClickedPos[lVar27] = (pIVar49->IO).MousePos;
        (pIVar49->IO).MouseDownWasDoubleClick[lVar27] = (pIVar49->IO).MouseDoubleClicked[lVar27];
        pIVar7 = (pIVar49->IO).MouseDragMaxDistanceAbs + lVar27;
        pIVar7->x = 0.0;
        pIVar7->y = 0.0;
        (pIVar49->IO).MouseDragMaxDistanceSqr[lVar27] = 0.0;
      }
    }
    else {
      (pIVar49->IO).MouseClicked[lVar27] = false;
      fVar57 = (pIVar49->IO).MouseDownDuration[lVar27];
      (pIVar49->IO).MouseReleased[lVar27] = 0.0 <= fVar57;
      pbVar42 = (pIVar49->IO).MouseClicked + lVar27;
      (pIVar49->IO).MouseDownDurationPrev[lVar27] = fVar57;
      (pIVar49->IO).MouseDownDuration[lVar27] = -1.0;
      (pIVar49->IO).MouseDoubleClicked[lVar27] = false;
    }
    if (((pIVar49->IO).MouseDown[lVar27] == false) && ((pIVar49->IO).MouseReleased[lVar27] == false)
       ) {
      (pIVar49->IO).MouseDownWasDoubleClick[lVar27] = false;
    }
    if (*pbVar42 == true) {
      pIVar49->NavDisableMouseHover = false;
    }
  }
  DockContextUpdateUndocking(ctx);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar33 = GetTopMostPopupModal();
  if ((pIVar33 != (ImGuiWindow *)0x0) ||
     ((ctx->NavWindowingTarget != (ImGuiWindow *)0x0 && (0.0 < ctx->NavWindowingHighlightAlpha)))) {
    fVar57 = (ctx->IO).DeltaTime * 6.0 + ctx->DimBgRatio;
    if (1.0 <= fVar57) {
      fVar57 = 1.0;
    }
    ctx->DimBgRatio = fVar57;
  }
  else {
    fVar57 = (ctx->IO).DeltaTime * -10.0 + ctx->DimBgRatio;
    ctx->DimBgRatio = (float)(-(uint)(0.0 <= fVar57) & (uint)fVar57);
  }
  ctx->MouseCursor = 0;
  ctx->WantTextInputNextFrame = -1;
  ctx->WantCaptureMouseNextFrame = -1;
  ctx->WantCaptureKeyboardNextFrame = -1;
  (ctx->PlatformImePos).x = 1.0;
  (ctx->PlatformImePos).y = 1.0;
  ctx->PlatformImePosViewport = (ImGuiViewportP *)0x0;
  pIVar49 = GImGui;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar19 = IsMousePosValid((ImVec2 *)0x0);
    if (((bVar19) &&
        (fVar57 = (pIVar49->IO).MouseDragThreshold,
        fVar71 = (pIVar49->IO).MousePos.x - (pIVar49->WheelingWindowRefMousePos).x,
        fVar72 = (pIVar49->IO).MousePos.y - (pIVar49->WheelingWindowRefMousePos).y,
        fVar57 * fVar57 < fVar71 * fVar71 + fVar72 * fVar72)) ||
       (pIVar49->WheelingWindowTimer <= 0.0)) {
      pIVar49->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar49->WheelingWindowTimer = 0.0;
    }
  }
  fVar57 = (pIVar49->IO).MouseWheel;
  if (((((fVar57 != 0.0) || (fVar71 = (pIVar49->IO).MouseWheelH, fVar71 != 0.0)) || (NAN(fVar71)))
      && ((pIVar33 = pIVar49->WheelingWindow, pIVar33 != (ImGuiWindow *)0x0 ||
          (pIVar33 = pIVar49->HoveredWindow, pIVar33 != (ImGuiWindow *)0x0)))) &&
     (pIVar33->Collapsed == false)) {
    if ((fVar57 != 0.0) || (NAN(fVar57))) {
      if ((pIVar49->IO).KeyCtrl == true) {
        if ((pIVar49->IO).FontAllowUserScaling == true) {
          StartLockWheelingWindow(pIVar33);
          fVar57 = pIVar33->FontWindowScale;
          fVar72 = (pIVar49->IO).MouseWheel * 0.1 + fVar57;
          fVar71 = 2.5;
          if (fVar72 <= 2.5) {
            fVar71 = fVar72;
          }
          fVar71 = (float)(-(uint)(fVar72 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar72 < 0.5) & (uint)fVar71);
          pIVar33->FontWindowScale = fVar71;
          if ((pIVar33->Flags & 0x1000000) == 0) {
            fVar71 = fVar71 / fVar57;
            fVar57 = (pIVar33->Pos).x;
            fVar72 = (pIVar33->Pos).y;
            IVar59 = pIVar33->Size;
            auVar77._8_8_ = 0;
            auVar77._0_4_ = IVar59.x;
            auVar77._4_4_ = IVar59.y;
            IVar60 = (pIVar49->IO).MousePos;
            auVar79._0_4_ = (IVar60.x - fVar57) * (1.0 - fVar71) * IVar59.x;
            auVar79._4_4_ = (IVar60.y - fVar72) * (1.0 - fVar71) * IVar59.y;
            auVar79._8_8_ = 0;
            auVar75 = divps(auVar79,auVar77);
            local_b8.Min.x = auVar75._0_4_ + fVar57;
            local_b8.Min.y = auVar75._4_4_ + fVar72;
            SetWindowPos(pIVar33,&local_b8.Min,0);
            IVar63.x = (float)(int)((pIVar33->Size).x * fVar71);
            IVar63.y = (float)(int)((pIVar33->Size).y * fVar71);
            IVar16.y = (float)(int)((pIVar33->SizeFull).y * fVar71);
            IVar16.x = (float)(int)((pIVar33->SizeFull).x * fVar71);
            pIVar33->Size = IVar63;
            pIVar33->SizeFull = IVar16;
          }
          goto LAB_0012325a;
        }
      }
      else if ((pIVar49->IO).KeyShift == false) {
        StartLockWheelingWindow(pIVar33);
        while ((uVar53 = pIVar33->Flags, (uVar53 >> 0x18 & 1) != 0 &&
               (((uVar53 & 0x210) == 0x10 ||
                ((fVar71 = (pIVar33->ScrollMax).y, fVar71 == 0.0 && (!NAN(fVar71)))))))) {
          pIVar33 = pIVar33->ParentWindow;
        }
        if ((uVar53 & 0x210) == 0) {
          fVar72 = ((pIVar33->InnerRect).Max.y - (pIVar33->InnerRect).Min.y) * 0.67;
          fVar58 = ImGuiWindow::CalcFontSize(pIVar33);
          fVar71 = fVar58 * 5.0;
          if (fVar72 <= fVar58 * 5.0) {
            fVar71 = fVar72;
          }
          (pIVar33->ScrollTarget).y = (pIVar33->Scroll).y - fVar57 * (float)(int)fVar71;
          (pIVar33->ScrollTargetCenterRatio).y = 0.0;
          (pIVar33->ScrollTargetEdgeSnapDist).y = 0.0;
        }
      }
    }
    fVar57 = (pIVar49->IO).MouseWheelH;
    if (((fVar57 == 0.0) && (!NAN(fVar57))) || ((pIVar49->IO).KeyShift == true)) {
      fVar57 = (pIVar49->IO).MouseWheel;
      if (((fVar57 == 0.0) && (!NAN(fVar57))) || ((pIVar49->IO).KeyShift != true))
      goto LAB_0012325a;
    }
    if ((pIVar49->IO).KeyCtrl == false) {
      StartLockWheelingWindow(pIVar33);
      while ((uVar53 = pIVar33->Flags, (uVar53 >> 0x18 & 1) != 0 &&
             (((uVar53 & 0x210) == 0x10 ||
              ((fVar71 = (pIVar33->ScrollMax).x, fVar71 == 0.0 && (!NAN(fVar71)))))))) {
        pIVar33 = pIVar33->ParentWindow;
      }
      if ((uVar53 & 0x210) == 0) {
        fVar72 = ((pIVar33->InnerRect).Max.x - (pIVar33->InnerRect).Min.x) * 0.67;
        fVar58 = ImGuiWindow::CalcFontSize(pIVar33);
        fVar71 = fVar58 + fVar58;
        if (fVar72 <= fVar58 + fVar58) {
          fVar71 = fVar72;
        }
        (pIVar33->ScrollTarget).x = (pIVar33->Scroll).x - fVar57 * (float)(int)fVar71;
        (pIVar33->ScrollTargetCenterRatio).x = 0.0;
        (pIVar33->ScrollTargetEdgeSnapDist).x = 0.0;
      }
    }
  }
LAB_0012325a:
  pIVar49 = GImGui;
  pIVar33 = GImGui->NavWindow;
  if ((((pIVar33 == (ImGuiWindow *)0x0) || (pIVar33->Active != true)) ||
      ((pIVar33->Flags & 0x40000) != 0)) || ((GImGui->IO).KeyCtrl != false)) {
    bVar19 = false;
  }
  else {
    bVar19 = IsKeyPressedMap(0,true);
  }
  pIVar49->FocusTabPressed = bVar19;
  if ((bVar19 == false) || (pIVar49->ActiveId != 0)) {
    pIVar33 = pIVar49->FocusRequestNextWindow;
  }
  else {
    pIVar33 = pIVar49->NavWindow;
    pIVar49->FocusRequestNextWindow = pIVar33;
    pIVar49->FocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar49->NavId == 0) || (pIVar49->NavIdTabCounter == 0x7fffffff)) {
      iVar39 = -(uint)(pIVar49->IO).KeyShift;
    }
    else {
      iVar39 = pIVar49->NavIdTabCounter + (-(uint)(pIVar49->IO).KeyShift | 1) + 1;
    }
    pIVar49->FocusRequestNextCounterTabStop = iVar39;
  }
  pIVar49->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar49->FocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar49->FocusRequestCurrCounterTabStop = 0x7fffffff;
  if (pIVar33 != (ImGuiWindow *)0x0) {
    pIVar49->FocusRequestCurrWindow = pIVar33;
    if ((pIVar49->FocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar39 = (pIVar33->DC).FocusCounterRegular, iVar39 != -1)) {
      pIVar49->FocusRequestCurrCounterRegular =
           (pIVar49->FocusRequestNextCounterRegular + iVar39 + 1) % (iVar39 + 1);
    }
    if ((pIVar49->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar39 = (pIVar33->DC).FocusCounterTabStop, iVar39 != -1)) {
      pIVar49->FocusRequestCurrCounterTabStop =
           (pIVar49->FocusRequestNextCounterTabStop + iVar39 + 1) % (iVar39 + 1);
    }
    pIVar49->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar49->FocusRequestNextCounterRegular = 0x7fffffff;
    pIVar49->FocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar49->NavIdTabCounter = 0x7fffffff;
  iVar39 = (ctx->WindowsFocusOrder).Size;
  if (iVar39 == (ctx->Windows).Size) {
    local_d8 = (ctx->IO).ConfigWindowsMemoryCompactTimer;
    if (0.0 <= local_d8) {
      local_d8 = (float)ctx->Time - local_d8;
    }
    else {
      local_d8 = 3.4028235e+38;
    }
    for (iVar51 = 0; iVar51 != iVar39; iVar51 = iVar51 + 1) {
      ppIVar31 = ImVector<ImGuiWindow_*>::operator[](&ctx->Windows,iVar51);
      pIVar33 = *ppIVar31;
      bVar19 = pIVar33->Active;
      pIVar33->WasActive = bVar19;
      pIVar33->BeginCount = 0;
      pIVar33->Active = false;
      pIVar33->WriteAccessed = false;
      if (((bVar19 == false) && (pIVar33->MemoryCompacted == false)) &&
         (pIVar33->LastTimeActive <= local_d8 && local_d8 != pIVar33->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar33);
      }
      iVar39 = (ctx->Windows).Size;
    }
    if ((ctx->NavWindow != (ImGuiWindow *)0x0) && (ctx->NavWindow->WasActive == false)) {
      FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
    }
    ImVector<ImGuiWindow_*>::resize(&ctx->CurrentWindowStack,0);
    ImVector<ImGuiPopupData>::resize(&ctx->BeginPopupStack,0);
    ClosePopupsOverWindow(ctx->NavWindow,false);
    DockContextUpdateDocking(ctx);
    pIVar49 = GImGui;
    GImGui->DebugItemPickerBreakId = 0;
    if (pIVar49->DebugItemPickerActive == true) {
      uVar53 = pIVar49->HoveredIdPreviousFrame;
      pIVar49->MouseCursor = 7;
      bVar19 = IsKeyPressedMap(0xe,true);
      if (bVar19) {
        pIVar49->DebugItemPickerActive = false;
      }
      pIVar18 = GImGui;
      fVar57 = (GImGui->IO).MouseDownDuration[0];
      if ((fVar57 != 0.0) || (NAN(fVar57))) {
        uVar52 = (uint)(uVar53 == 0);
      }
      else if (uVar53 == 0) {
        uVar52 = 1;
      }
      else {
        pIVar49->DebugItemPickerBreakId = uVar53;
        pIVar49->DebugItemPickerActive = false;
        uVar52 = 0;
      }
      pIVar5 = &pIVar18->NextWindowData;
      *(byte *)&pIVar5->Flags = (byte)pIVar5->Flags | 0x40;
      (pIVar18->NextWindowData).BgAlphaVal = 0.6;
      BeginTooltip();
      Text("HoveredId: 0x%08X",(ulong)uVar53);
      Text("Press ESC to abort picking.");
      TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar52 << 4)),
                  "Click to break in debugger!");
      EndTooltip();
      pIVar49 = GImGui;
    }
    ctx->WithinFrameScopeWithImplicitWindow = true;
    *(byte *)&(pIVar49->NextWindowData).Flags = (byte)(pIVar49->NextWindowData).Flags | 2;
    (pIVar49->NextWindowData).SizeVal.x = 400.0;
    (pIVar49->NextWindowData).SizeVal.y = 400.0;
    (pIVar49->NextWindowData).SizeCond = 4;
    Begin("Debug##Default",(bool *)0x0,0);
    if (ctx->CurrentWindow->IsFallbackWindow != false) {
      CallContextHooks(ctx,ImGuiContextHookType_NewFramePost);
      return;
    }
    __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x100f,"void ImGui::NewFrame()");
  }
  __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0xfea,"void ImGui::NewFrame()");
LAB_001212ad:
  bVar19 = pIVar32->PlatformWindowCreated;
  if (((uVar53 >> 10 & 1) != 0) &&
     ((((pIVar32->super_ImGuiViewport).Flags & 0x80) == 0 & bVar19) == 1)) {
    if ((pIVar32->super_ImGuiViewport).PlatformRequestMove == true) {
      IVar59 = (*(pIVar49->PlatformIO).Platform_GetWindowPos)(&pIVar32->super_ImGuiViewport);
      pIVar32->LastPlatformPos = IVar59;
      (pIVar32->super_ImGuiViewport).Pos = IVar59;
    }
    if ((pIVar32->super_ImGuiViewport).PlatformRequestResize == true) {
      IVar59 = (*(pIVar49->PlatformIO).Platform_GetWindowSize)(&pIVar32->super_ImGuiViewport);
      pIVar32->LastPlatformSize = IVar59;
      (pIVar32->super_ImGuiViewport).Size = IVar59;
    }
  }
  UpdateViewportPlatformMonitor(pIVar32);
  IVar59 = pIVar32->CurrWorkOffsetMax;
  (pIVar32->super_ImGuiViewport).WorkOffsetMin = pIVar32->CurrWorkOffsetMin;
  (pIVar32->super_ImGuiViewport).WorkOffsetMax = IVar59;
  (pIVar32->CurrWorkOffsetMin).x = 0.0;
  (pIVar32->CurrWorkOffsetMin).y = 0.0;
  (pIVar32->CurrWorkOffsetMax).x = 0.0;
  (pIVar32->CurrWorkOffsetMax).y = 0.0;
  pIVar32->Alpha = 1.0;
  if (((pIVar32->super_ImGuiViewport).Flags & 0x200) != 0) {
    pIVar1 = &(pIVar32->super_ImGuiViewport).Pos;
    IVar59 = *pIVar1;
    IVar60 = pIVar32->LastPos;
    iVar51 = -(uint)(IVar59.x - IVar60.x != 0.0);
    iVar54 = -(uint)(IVar59.y - IVar60.y != 0.0);
    auVar65._4_4_ = iVar54;
    auVar65._0_4_ = iVar51;
    auVar65._8_4_ = iVar54;
    auVar65._12_4_ = iVar54;
    auVar64._8_8_ = auVar65._8_8_;
    auVar64._4_4_ = iVar51;
    auVar64._0_4_ = iVar51;
    iVar51 = movmskpd(extraout_EAX,auVar64);
    if (iVar51 != 0) {
      TranslateWindowsInViewport(pIVar32,&pIVar32->LastPos,pIVar1);
    }
  }
  p_Var13 = (pIVar49->PlatformIO).Platform_GetWindowDpiScale;
  if ((p_Var13 == (_func_float_ImGuiViewport_ptr *)0x0) || (bVar19 == false)) {
    if (pIVar32->PlatformMonitor == -1) {
      fVar57 = (pIVar32->super_ImGuiViewport).DpiScale;
      uVar52 = -(uint)(fVar57 != 0.0);
      fVar57 = (float)(~uVar52 & 0x3f800000 | (uint)fVar57 & uVar52);
      uVar68 = 0;
      uVar69 = 0;
      uVar70 = 0;
    }
    else {
      pIVar29 = ImVector<ImGuiPlatformMonitor>::operator[]
                          (&(pIVar49->PlatformIO).Monitors,(int)pIVar32->PlatformMonitor);
      fVar57 = pIVar29->DpiScale;
      uVar68 = 0;
      uVar69 = 0;
      uVar70 = 0;
    }
  }
  else {
    fVar57 = (*p_Var13)(&pIVar32->super_ImGuiViewport);
    uVar68 = extraout_var._0_4_;
    uVar69 = extraout_var._4_4_;
    uVar70 = extraout_var._8_4_;
  }
  fVar71 = (pIVar32->super_ImGuiViewport).DpiScale;
  if ((fVar71 != 0.0) || (NAN(fVar71))) {
    if (((fVar57 != fVar71) || (NAN(fVar57) || NAN(fVar71))) &&
       (((pIVar49->IO).ConfigFlags & 0x4000) != 0)) {
      local_48 = fVar57;
      uStack_44 = uVar68;
      uStack_40 = uVar69;
      uStack_3c = uVar70;
      ScaleWindowsInViewport(pIVar32,fVar57 / fVar71);
      fVar57 = local_48;
    }
  }
  (pIVar32->super_ImGuiViewport).DpiScale = fVar57;
  uVar48 = (ulong)(iVar39 + 1);
  goto LAB_001211ca;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    g.ConfigFlagsLastFrame = g.ConfigFlagsCurrFrame;
    ErrorCheckNewFrameSanityChecks();
    g.ConfigFlagsCurrFrame = g.IO.ConfigFlags;

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    // FIXME-VIEWPORT: the concept of a single ClipRectFullscreen is not ideal!
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(virtual_space.Min.x, virtual_space.Min.y, virtual_space.Max.x, virtual_space.Max.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleSegmentMaxError(g.Style.CircleSegmentMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawData = NULL;
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Undocking
    // (needs to be before UpdateMouseMovingWindowNewFrame so the window is already offset and following the mouse on the detaching frame)
    DockContextUpdateUndocking(&g);

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default
    g.PlatformImePosViewport = NULL;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.IO.ConfigWindowsMemoryCompactTimer >= 0.0f) ? (float)g.Time - g.IO.ConfigWindowsMemoryCompactTimer : FLT_MAX;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // Docking
    DockContextUpdateDocking(&g);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}